

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> *this;
  idx_t iVar1;
  ArenaAllocator *this_00;
  ulong uVar2;
  STORAGE_TYPE *__s;
  InvalidInputException *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  TYPE arg_val;
  TYPE val_val;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  EXTRA_STATE arg_extra_state;
  anon_union_16_2_67f50693_for_value local_1f8;
  char local_1e8 [16];
  ulong local_1d8;
  data_ptr_t local_1d0;
  anon_union_16_2_67f50693_for_value local_1c8;
  UnifiedVectorFormat local_1b8;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  EXTRA_STATE local_98;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_1b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  MinMaxFallbackValue::CreateExtraState(&local_98,inputs + 1,count);
  Vector::ToUnifiedFormat(inputs,count,&local_128);
  MinMaxFallbackValue::PrepareData(inputs + 1,count,&local_98,&local_170);
  Vector::ToUnifiedFormat(inputs + 2,count,&local_1b8);
  Vector::ToUnifiedFormat(state_vector,count,&local_e0);
  if (count != 0) {
    local_1d0 = local_e0.data;
    uVar4 = 0;
    local_1d8 = count;
    do {
      uVar6 = uVar4;
      if ((local_170.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_170.sel)->sel_vector[uVar4];
      }
      uVar5 = uVar4;
      if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_128.sel)->sel_vector[uVar4];
      }
      if (((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
            >> (uVar6 & 0x3f) & 1) != 0)) &&
         ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
            >> (uVar5 & 0x3f) & 1) != 0)))) {
        uVar2 = uVar4;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_e0.sel)->sel_vector[uVar4];
        }
        this = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> **)
                (local_1d0 + uVar2 * 8);
        if ((char)this[1].capacity == '\0') {
          uVar2 = uVar4;
          if ((local_1b8.sel)->sel_vector != (sel_t *)0x0) {
            uVar2 = (ulong)(local_1b8.sel)->sel_vector[uVar4];
          }
          if (local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            if ((local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) {
              pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_1f8._0_8_ = local_1e8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f8,
                         "Invalid input for arg_min/arg_max: n value cannot be NULL","");
              InvalidInputException::InvalidInputException(pIVar3,(string *)&local_1f8.pointer);
              __cxa_throw(pIVar3,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
          }
          iVar1 = *(idx_t *)(local_1b8.data + uVar2 * 8);
          if ((long)iVar1 < 1) {
            pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1f8._0_8_ = local_1e8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,"Invalid input for arg_min/arg_max: n value must be > 0"
                       ,"");
            InvalidInputException::InvalidInputException(pIVar3,(string *)&local_1f8.pointer);
            __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if (999999 < (long)iVar1) {
            pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1f8._0_8_ = local_1e8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,
                       "Invalid input for arg_min/arg_max: n value must be < %d","");
            InvalidInputException::InvalidInputException<long>
                      (pIVar3,(string *)&local_1f8.pointer,1000000);
            __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          this_00 = aggr_input->allocator;
          this->capacity = iVar1;
          __s = (STORAGE_TYPE *)ArenaAllocator::AllocateAligned(this_00,iVar1 << 6);
          switchD_005700f1::default(__s,0,this->capacity << 6);
          this->heap = __s;
          this->size = 0;
          *(undefined1 *)&this[1].capacity = 1;
          count = local_1d8;
        }
        local_1f8._0_8_ = *(undefined8 *)(local_170.data + uVar6 * 0x10);
        local_1f8.pointer.ptr = (char *)*(undefined8 *)(local_170.data + uVar6 * 0x10 + 8);
        local_1c8._0_8_ = *(undefined8 *)(local_128.data + uVar5 * 0x10);
        local_1c8.pointer.ptr = (char *)*(undefined8 *)(local_128.data + uVar5 * 0x10 + 8);
        BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan>::Insert
                  (this,aggr_input->allocator,(string_t *)&local_1f8.pointer,
                   (string_t *)&local_1c8.pointer);
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}